

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coloredmesh.cc
# Opt level: O1

void __thiscall
gvr::ColoredMesh::ColoredMesh
          (ColoredMesh *this,ColoredMesh *p,vector<bool,_std::allocator<bool>_> *vused,
          vector<bool,_std::allocator<bool>_> *tused)

{
  int iVar1;
  uchar *puVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  
  Mesh::Mesh(&this->super_Mesh,&p->super_Mesh,vused,tused);
  (this->super_Mesh).super_PointCloud.super_Model._vptr_Model =
       (_func_int **)&PTR__ColoredMesh_001319c8;
  iVar5 = (this->super_Mesh).super_PointCloud.n;
  iVar1 = -1;
  if (-1 < iVar5) {
    iVar1 = iVar5 * 3;
  }
  puVar2 = (uchar *)operator_new__((long)iVar1);
  this->rgb = puVar2;
  if (0 < (p->super_Mesh).super_PointCloud.n) {
    lVar3 = 0;
    uVar4 = 0;
    iVar5 = 0;
    do {
      if ((*(ulong *)(*(long *)vused + (uVar4 >> 6) * 8) >> (uVar4 & 0x3f) & 1) != 0) {
        this->rgb[iVar5] = p->rgb[lVar3];
        this->rgb[(long)iVar5 + 1] = p->rgb[lVar3 + 1];
        this->rgb[(long)iVar5 + 2] = p->rgb[lVar3 + 2];
        iVar5 = iVar5 + 3;
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 3;
    } while ((long)uVar4 < (long)(p->super_Mesh).super_PointCloud.n);
  }
  return;
}

Assistant:

ColoredMesh::ColoredMesh(const ColoredMesh &p, const std::vector<bool> &vused,
                         const std::vector<bool> &tused) : Mesh(p, vused, tused)
{
  rgb=new unsigned char [3*getVertexCount()];

  int k=0;

  for (int i=0; i<p.getVertexCount(); i++)
  {
    if (vused[i])
    {
      rgb[k++]=p.getColorComp(i, 0);
      rgb[k++]=p.getColorComp(i, 1);
      rgb[k++]=p.getColorComp(i, 2);
    }
  }
}